

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haar_transform.cpp
# Opt level: O0

void anon_unknown.dwarf_1e9d7::inverseTransform<float>
               (vector<float,_std::allocator<float>_> *input,
               vector<float,_std::allocator<float>_> *output,size_t width,size_t height)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  undefined8 uVar4;
  float *pfVar5;
  float *pfVar6;
  long lVar7;
  ulong in_RCX;
  ulong in_RDX;
  vector<float,_std::allocator<float>_> *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  float fVar8;
  double dVar9;
  float *outputYEnd;
  size_t halfHeight;
  float *outputX;
  float *inputXEnd;
  float *inputX;
  float *outputXEnd;
  float *outputX_1;
  float *inputX_1;
  size_t halfWidth;
  float *outputY;
  float *inputYEnd;
  float *inputY;
  vector<float,_std::allocator<float>_> temp;
  float coefficient;
  allocator_type *in_stack_ffffffffffffff40;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  imageException *in_stack_ffffffffffffff60;
  float *local_90;
  float *local_80;
  float *local_78;
  float *local_68;
  float *local_58;
  
  bVar1 = std::vector<float,_std::allocator<float>_>::empty
                    ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff40);
  if (!bVar1) {
    sVar2 = std::vector<float,_std::allocator<float>_>::size(in_RDI);
    sVar3 = std::vector<float,_std::allocator<float>_>::size(in_RSI);
    if (sVar2 == sVar3) {
      sVar3 = std::vector<float,_std::allocator<float>_>::size(in_RDI);
      if (((sVar3 == in_RDX * in_RCX) && ((in_RDX & 1) == 0)) && ((in_RCX & 1) == 0)) {
        dVar9 = std::sqrt(SUB648(ZEXT464(0x40000000),0));
        fVar8 = 1.0 / SUB84(dVar9,0);
        std::vector<float,_std::allocator<float>_>::size(in_RDI);
        std::allocator<float>::allocator((allocator<float> *)0x115763);
        std::vector<float,_std::allocator<float>_>::vector
                  (in_stack_ffffffffffffff50,sVar2,in_stack_ffffffffffffff40);
        std::allocator<float>::~allocator((allocator<float> *)0x115789);
        local_58 = std::vector<float,_std::allocator<float>_>::data
                             ((vector<float,_std::allocator<float>_> *)0x115796);
        pfVar5 = std::vector<float,_std::allocator<float>_>::data
                           ((vector<float,_std::allocator<float>_> *)0x1157ab);
        sVar2 = std::vector<float,_std::allocator<float>_>::size(in_RDI);
        local_68 = std::vector<float,_std::allocator<float>_>::data
                             ((vector<float,_std::allocator<float>_> *)0x1157dc);
        for (; local_58 != pfVar5 + sVar2; local_58 = local_58 + in_RDX) {
          local_78 = local_58;
          for (local_80 = local_68; local_80 != local_68 + in_RDX; local_80 = local_80 + 2) {
            *local_80 = (*local_78 - local_78[in_RDX >> 1]) * fVar8;
            local_80[1] = (*local_78 + local_78[in_RDX >> 1]) * fVar8;
            local_78 = local_78 + 1;
          }
          local_68 = local_68 + in_RDX;
        }
        local_90 = std::vector<float,_std::allocator<float>_>::data
                             ((vector<float,_std::allocator<float>_> *)0x115926);
        pfVar5 = std::vector<float,_std::allocator<float>_>::data
                           ((vector<float,_std::allocator<float>_> *)0x115938);
        pfVar6 = std::vector<float,_std::allocator<float>_>::data
                           ((vector<float,_std::allocator<float>_> *)0x115959);
        lVar7 = (in_RCX >> 1) * in_RDX;
        for (; local_90 != pfVar5 + in_RDX; local_90 = local_90 + 1) {
          local_58 = local_90;
          for (local_68 = pfVar6; local_68 != pfVar6 + in_RCX * in_RDX;
              local_68 = local_68 + in_RDX * 2) {
            *local_68 = (*local_58 - local_58[lVar7]) * fVar8;
            local_68[in_RDX] = (*local_58 + local_58[lVar7]) * fVar8;
            local_58 = local_58 + in_RDX;
          }
          pfVar6 = pfVar6 + 1;
        }
        std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff40);
        return;
      }
    }
  }
  uVar4 = __cxa_allocate_exception(0x28);
  imageException::imageException(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  __cxa_throw(uVar4,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void inverseTransform( const std::vector< _Type > & input, std::vector< _Type > & output, size_t width, size_t height )
    {
        if ( input.empty() || input.size() != output.size() || input.size() != width * height || (width % 2) != 0 || (height % 2) != 0 )
            throw imageException( "Incorrect input parameters for Haar inverse transform" );

        // Inverse Haar Matrix
        // | 1/sqrt(2) -1/sqrt(2) |
        // | 1/sqrt(2)  1/sqrt(2) |

        // Having 2 pixel intensities x and y we would have new values
        // a = x * (1 / sqrt(2)) - y * (1 / sqrt(2)) = (x - y) * (1 / sqrt(2))
        // b = x * (1 / sqrt(2)) + y * (1 / sqrt(2)) = (x + y) * (1 / sqrt(2))

        const _Type coefficient = 1.0f / std::sqrt(2.0f);
        std::vector< _Type > temp( input.size() );

        // Transform by X
        const _Type * inputY    = input.data();
        const _Type * inputYEnd = input.data() + input.size();
        _Type       * outputY   = temp.data();

        const size_t halfWidth = width / 2;

        for ( ; inputY != inputYEnd; inputY += width, outputY += width ) {
            const _Type * inputX     = inputY;
            _Type       * outputX    = outputY;
            const _Type * outputXEnd = outputY + width;
            for( ; outputX != outputXEnd; ++inputX, outputX += 2 ) {
                *(outputX    ) = (*(inputX) - *(inputX + halfWidth)) * coefficient;
                *(outputX + 1) = (*(inputX) + *(inputX + halfWidth)) * coefficient;
            }
        }

        // Transform by Y
        const _Type * inputX    = temp.data();
        const _Type * inputXEnd = temp.data() + width;
        _Type       * outputX   = output.data();

        const size_t halfHeight = (height / 2) * width;

        for ( ; inputX != inputXEnd; ++inputX, ++outputX ) {
            inputY     = inputX;
            outputY    = outputX;
            const _Type * outputYEnd = outputX + height * width;
            for( ; outputY != outputYEnd; inputY += width, outputY += 2 * width ) {
                *(outputY        ) = (*(inputY) - *(inputY + halfHeight)) * coefficient;
                *(outputY + width) = (*(inputY) + *(inputY + halfHeight)) * coefficient;
            }
        }
    }